

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O1

void __thiscall Satyricon::Literal_Heap::initialize(Literal_Heap *this)

{
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *this_00;
  pointer pLVar1;
  iterator iVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  Literal l;
  Literal local_2c;
  
  this_00 = &this->value;
  pLVar1 = (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::reserve
            (this_00,(long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
  uVar5 = (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (0 < (int)(uVar5 >> 1)) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      iVar2._M_current =
           (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_2c.value = uVar8;
        std::vector<Satyricon::Literal,std::allocator<Satyricon::Literal>>::
        _M_realloc_insert<Satyricon::Literal_const&>
                  ((vector<Satyricon::Literal,std::allocator<Satyricon::Literal>> *)this_00,iVar2,
                   &local_2c);
      }
      else {
        (iVar2._M_current)->value = uVar8;
        (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        local_2c.value = uVar8;
      }
      iVar2._M_current =
           (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(uint)local_2c.value] =
           (int)((ulong)((long)iVar2._M_current -
                        (long)(this->value).
                              super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
      local_2c.value = uVar8 + 1;
      if (iVar2._M_current ==
          (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Satyricon::Literal,std::allocator<Satyricon::Literal>>::
        _M_realloc_insert<Satyricon::Literal_const&>
                  ((vector<Satyricon::Literal,std::allocator<Satyricon::Literal>> *)this_00,iVar2,
                   &local_2c);
      }
      else {
        (iVar2._M_current)->value = local_2c.value;
        (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      piVar3 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3[(uint)local_2c.value] =
           (int)((ulong)((long)(this->value).
                               super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->value).
                              super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
      iVar7 = iVar7 + 1;
      uVar5 = (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
      uVar8 = uVar8 + 2;
    } while (iVar7 < (int)(uVar5 >> 1));
  }
  uVar6 = (long)(this->value).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->value).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar9 = (long)uVar6 >> 2;
  if (uVar9 == uVar5) {
    if ((uVar6 >> 0x22 & 1) == 0) {
      uVar5 = uVar9 >> 1 & 0x7fffffff;
      do {
        heapify(this,uVar5);
        bVar4 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar4);
    }
    return;
  }
  __assert_fail("value.size() == map_position.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                ,0xdf,"void Satyricon::Literal_Heap::initialize()");
}

Assistant:

void initialize() {
        value.clear();
        value.reserve(map_position.size());

        for ( int i = 0; i < static_cast<int>(map_position.size()/2); ++i ) {

            Literal l(i,false);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

            l = Literal(i,true);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

        }
        assert( value.size() == map_position.size());

        for ( int i = value.size()/2; i >= 0; --i )
            heapify(i);

    }